

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void map_deinit_(map_base_t *m)

{
  map_node_t *pmVar1;
  map_node_t *__ptr;
  long lVar2;
  bool bVar3;
  
  lVar2 = (long)(int)m->nbuckets;
  while( true ) {
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    __ptr = m->buckets[lVar2];
    while (__ptr != (map_node_t *)0x0) {
      pmVar1 = __ptr->next;
      free(__ptr);
      __ptr = pmVar1;
    }
  }
  free(m->buckets);
  return;
}

Assistant:

void map_deinit_(map_base_t *m) {
  map_node_t *next, *node;
  int i;
  i = m->nbuckets;
  while (i--) {
    node = m->buckets[i];
    while (node) {
      next = node->next;
      free(node);
      node = next;
    }
  }
  free(m->buckets);
}